

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Expression_*> * __thiscall
wasm::IRBuilder::build(Result<wasm::Expression_*> *__return_storage_ptr__,IRBuilder *this)

{
  undefined8 *puVar1;
  pointer __pos;
  pointer pSVar2;
  pointer ppEVar3;
  Expression *pEVar4;
  undefined1 *puVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  MixedArena *this_00;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  __pos = (this->scopeStack).
          super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>.
          _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->scopeStack).
           super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__pos == pSVar2) {
    this_00 = &((this->builder).wasm)->allocator;
    puVar5 = (undefined1 *)MixedArena::allocSpace(this_00,0x40,8);
    *puVar5 = 1;
    *(undefined8 *)(puVar5 + 8) = 0;
    *(undefined8 *)(puVar5 + 0x10) = 0;
    *(undefined8 *)(puVar5 + 0x18) = 0;
    *(undefined8 *)(puVar5 + 0x20) = 0;
    *(undefined8 *)(puVar5 + 0x28) = 0;
    *(undefined8 *)(puVar5 + 0x30) = 0;
    *(MixedArena **)(puVar5 + 0x38) = this_00;
    *(undefined1 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> = puVar5;
LAB_00c93de0:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x20) = '\0';
  }
  else {
    if (((ulong)(((long)pSVar2 - (long)__pos >> 4) * 0x2e8ba2e8ba2e8ba3) < 2) &&
       (*(__index_type *)
         ((long)&pSVar2[-1].scope.
                 super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
         + 0x18) == '\0')) {
      ppEVar3 = pSVar2[-1].exprStack.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar7 = (long)ppEVar3 -
              (long)pSVar2[-1].exprStack.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (uVar7 < 9) {
        if (uVar7 != 8) {
          __assert_fail("scopeStack.back().exprStack.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                        ,0xae,"Result<Expression *> wasm::IRBuilder::build()");
        }
        pEVar4 = ppEVar3[-1];
        std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::
        _M_erase_at_end(&this->scopeStack,__pos);
        std::
        _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear(&(this->labelDepths)._M_h);
        *(Expression **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> = pEVar4;
        goto LAB_00c93de0;
      }
      pcVar8 = "unused expressions without block context";
      pcVar6 = "";
    }
    else {
      pcVar8 = "unfinished block context";
      pcVar6 = "";
    }
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar8,pcVar6);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Expression_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> = puVar1;
    if (local_40 == &local_30) {
      *puVar1 = CONCAT71(uStack_2f,local_30);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x18) = uStack_28;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> = local_40;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x10) =
           CONCAT71(uStack_2f,local_30);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 8) = local_38;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Expression*> IRBuilder::build() {
  if (scopeStack.empty()) {
    return builder.makeBlock();
  }
  if (scopeStack.size() > 1 || !scopeStack.back().isNone()) {
    return Err{"unfinished block context"};
  }
  if (scopeStack.back().exprStack.size() > 1) {
    return Err{"unused expressions without block context"};
  }
  assert(scopeStack.back().exprStack.size() == 1);
  auto* expr = scopeStack.back().exprStack.back();
  scopeStack.clear();
  labelDepths.clear();
  return expr;
}